

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg3.c
# Opt level: O0

_Bool borg_eat_unknown(void)

{
  char *what;
  borg_item *item;
  int local_10;
  wchar_t n;
  wchar_t i;
  
  item._4_4_ = -1;
  for (local_10 = 0; local_10 < (int)(uint)z_info->pack_size; local_10 = local_10 + 1) {
    if (((borg_items[local_10].iqty != '\0') && (borg_items[local_10].tval == '\x1c')) &&
       (borg_items[local_10].kind == 0)) {
      item._4_4_ = local_10;
    }
  }
  if (-1 < item._4_4_) {
    what = format("# Eating unknown mushroom %s.",borg_items + item._4_4_);
    borg_note(what);
    borg_keypress(0x45);
    borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[item._4_4_]);
    goal_item = -1;
    goal_ware = -1;
    goal_shop = -1;
  }
  return -1 < item._4_4_;
}

Assistant:

bool borg_eat_unknown(void)
{
    int i, n = -1;

    /* Scan the pack */
    for (i = 0; i < z_info->pack_size; i++) {
        borg_item* item = &borg_items[i];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* Require correct tval */
        if (item->tval != TV_FOOD)
            continue;

        /* Skip aware items */
        if (item->kind)
            continue;

        /* Save this item */
        n = i;
    }

    /* None available */
    if (n < 0)
        return (false);

    /* Log the message */
    borg_note(format("# Eating unknown mushroom %s.", borg_items[n].desc));

    /* Perform the action */
    borg_keypress('E');
    borg_keypress(all_letters_nohjkl[n]);

    /* Hack -- Clear "shop" goals */
    goal_shop = goal_ware = goal_item = -1;

    /* Success */
    return (true);
}